

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDRewrite(Abc_Ntk_t *pNtk,Dar_RwrPar_t *pPars)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  timespec ts;
  timespec local_30;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,0);
    if (pAig != (Aig_Man_t *)0x0) {
      Dar_ManRewrite(pAig,pPars);
      clock_gettime(3,&local_30);
      pMan = Aig_ManDupDfs(pAig);
      Aig_ManStop(pAig);
      pAVar1 = Abc_NtkFromDar(pNtk,pMan);
      Aig_ManStop(pMan);
    }
    return pAVar1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                ,0x5af,"Abc_Ntk_t *Abc_NtkDRewrite(Abc_Ntk_t *, Dar_RwrPar_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDRewrite( Abc_Ntk_t * pNtk, Dar_RwrPar_t * pPars )
{
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
//    Aig_ManPrintStats( pMan );
/*
//    Aig_ManSupports( pMan );
    {
        Vec_Vec_t * vParts;
        vParts = Aig_ManPartitionSmart( pMan, 50, 1, NULL );
        Vec_VecFree( vParts );
    }
*/
    Dar_ManRewrite( pMan, pPars );
//    pMan = Dar_ManBalance( pTemp = pMan, pPars->fUpdateLevel );
//    Aig_ManStop( pTemp );

clk = Abc_Clock();
    pMan = Aig_ManDupDfs( pTemp = pMan ); 
    Aig_ManStop( pTemp );
//ABC_PRT( "time", Abc_Clock() - clk );

//    Aig_ManPrintStats( pMan );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}